

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_cache.c
# Opt level: O2

uint64_t cache_hash6(uint64_t a,uint64_t b,uint64_t c,uint64_t d,uint64_t e,uint64_t f)

{
  return ((((((a >> 0x20 ^ a ^ 0xcbf29ce484222325) * 0x100000001b3 ^ b) * 0x100000001b3 ^ c) *
            0x100000001b3 ^ d) * 0x100000001b3 ^ e) * 0x100000001b3 ^ f) * 0x100000001b3;
}

Assistant:

static uint64_t
cache_hash6(uint64_t a, uint64_t b, uint64_t c, uint64_t d, uint64_t e, uint64_t f)
{
    const uint64_t prime = 1099511628211;
    uint64_t hash = 14695981039346656037LLU;
    hash = (hash ^ (a>>32));
    hash = (hash ^ a) * prime;
    hash = (hash ^ b) * prime;
    hash = (hash ^ c) * prime;
    hash = (hash ^ d) * prime;
    hash = (hash ^ e) * prime;
    hash = (hash ^ f) * prime;
    return hash;
}